

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O1

void __thiscall CheckStructure::check(CheckStructure *this,string *x)

{
  int iVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = this->m_countCalls;
  this->m_countCalls = iVar1 + 1;
  switch(iVar1) {
  case 0:
    paVar4 = &local_38.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,pcVar2 + x->_M_string_length);
    isType(this,&local_38);
    _Var3._M_p = local_38._M_dataplus._M_p;
    break;
  case 1:
    paVar4 = &local_58.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + x->_M_string_length);
    isMain(this,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
    break;
  case 2:
    paVar4 = &local_78.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + x->_M_string_length);
    isOpenedPar(this,&local_78);
    _Var3._M_p = local_78._M_dataplus._M_p;
    break;
  case 3:
    paVar4 = &local_98.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_98._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + x->_M_string_length);
    isClosedPar(this,&local_98);
    _Var3._M_p = local_98._M_dataplus._M_p;
    break;
  case 4:
    paVar4 = &local_b8.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar2,pcVar2 + x->_M_string_length);
    isOpenedBody(this,&local_b8);
    _Var3._M_p = local_b8._M_dataplus._M_p;
    break;
  case 5:
    paVar4 = &local_d8.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + x->_M_string_length);
    isReturn(this,&local_d8);
    _Var3._M_p = local_d8._M_dataplus._M_p;
    break;
  case 6:
    paVar4 = &local_f8.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_f8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + x->_M_string_length);
    isTypeOfReturnValue(this,&local_f8);
    _Var3._M_p = local_f8._M_dataplus._M_p;
    break;
  case 7:
    paVar4 = &local_118.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_118._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + x->_M_string_length);
    isClosedStatement(this,&local_118);
    _Var3._M_p = local_118._M_dataplus._M_p;
    break;
  case 8:
    paVar4 = &local_138.field_2;
    pcVar2 = (x->_M_dataplus)._M_p;
    local_138._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar2,pcVar2 + x->_M_string_length);
    isClosedBody(this,&local_138);
    _Var3._M_p = local_138._M_dataplus._M_p;
    break;
  default:
    goto switchD_00104a0a_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
switchD_00104a0a_default:
  return;
}

Assistant:

void CheckStructure::check(string x) {
    m_countCalls++;
    switch (m_countCalls) {
        case 1:
            isType(x);
            break;
        case 2:
            isMain(x);
            break;
        case 3:
            isOpenedPar(x);
            break;
        case 4:
            isClosedPar(x);
            break;
        case 5:
            isOpenedBody(x);
            break;
        case 6:
            isReturn(x);
            break;
        case 7:
            isTypeOfReturnValue(x);
            break;
        case 8:
            isClosedStatement(x);
            break;
        case 9:
            isClosedBody(x);
            break;
        default:
            break;
    }
}